

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::TraverseSchema::traverseIdentityConstraint
          (TraverseSchema *this,IdentityConstraint *ic,DOMElement *icElem)

{
  short sVar1;
  short sVar2;
  SchemaInfo *pSVar3;
  MemoryManager *pMVar4;
  XMLSize_t XVar5;
  XSAnnotation *pXVar6;
  int iVar7;
  XMLSize_t index;
  DOMElement *pDVar8;
  DOMNode *pDVar9;
  undefined4 extraout_var;
  XSAnnotation *pXVar11;
  long *plVar12;
  XMLCh *pXVar13;
  XercesXPath *pXVar14;
  IC_Selector *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  IC_Field *this_01;
  BaseRefVectorOf<xercesc_4_0::IC_Field> *this_02;
  undefined4 extraout_var_03;
  long lVar15;
  short *psVar16;
  bool bVar17;
  NamespaceScopeManager nsMgr;
  XSAnnotation *local_60;
  NamespaceScopeManager local_40;
  short *psVar10;
  undefined4 extraout_var_00;
  
  pSVar3 = this->fSchemaInfo;
  if (icElem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,icElem);
  }
  local_40.fSchemaInfo = pSVar3;
  pDVar8 = XUtil::getFirstChildElement(&icElem->super_DOMNode);
  pDVar9 = &checkContent(this,icElem,pDVar8,false,true)->super_DOMNode;
  local_60 = this->fAnnotation;
  if ((local_60 == (XSAnnotation *)0x0 & this->fScanner->fGenerateSyntheticAnnotations) == 1) {
    if (this->fNonXSAttList->fCurCount == 0) {
      local_60 = (XSAnnotation *)0x0;
    }
    else {
      local_60 = generateSyntheticAnnotation(this,icElem,this->fNonXSAttList);
      this->fAnnotation = local_60;
    }
  }
  if (pDVar9 == (DOMNode *)0x0) {
LAB_003316d0:
    if (local_60 != (XSAnnotation *)0x0) {
      (*(local_60->super_XSerializable)._vptr_XSerializable[1])();
    }
  }
  else {
    iVar7 = (*pDVar9->_vptr_DOMNode[0x18])(pDVar9);
    psVar10 = (short *)CONCAT44(extraout_var,iVar7);
    if (psVar10 != &SchemaSymbols::fgELT_SELECTOR) {
      psVar16 = &SchemaSymbols::fgELT_SELECTOR;
      if (psVar10 == (short *)0x0) {
LAB_00331598:
        if (*psVar16 == 0) goto LAB_003315ba;
      }
      else {
        do {
          sVar1 = *psVar10;
          if (sVar1 == 0) goto LAB_00331598;
          psVar10 = psVar10 + 1;
          sVar2 = *psVar16;
          psVar16 = psVar16 + 1;
        } while (sVar1 == sVar2);
      }
      reportSchemaError(this,(DOMElement *)pDVar9,L"http://apache.org/xml/messages/XMLErrors",0x83);
      goto LAB_003316d0;
    }
LAB_003315ba:
    GeneralAttributeCheck::checkAttributes
              (&this->fAttributeCheck,(DOMElement *)pDVar9,0x29,this,false,this->fNonXSAttList);
    pDVar8 = XUtil::getFirstChildElement(pDVar9);
    pDVar8 = checkContent(this,icElem,pDVar8,true,true);
    if (pDVar8 != (DOMElement *)0x0) {
      reportSchemaError(this,(DOMElement *)pDVar9,L"http://apache.org/xml/messages/XMLErrors",0x4d);
    }
    pXVar11 = this->fAnnotation;
    pXVar6 = local_60;
    if ((pXVar11 == (XSAnnotation *)0x0 & this->fScanner->fGenerateSyntheticAnnotations) == 1) {
      if (this->fNonXSAttList->fCurCount != 0) {
        pXVar11 = generateSyntheticAnnotation(this,(DOMElement *)pDVar9,this->fNonXSAttList);
        this->fAnnotation = pXVar11;
        goto LAB_0033165c;
      }
    }
    else {
LAB_0033165c:
      if ((pXVar11 != (XSAnnotation *)0x0) && (pXVar6 = pXVar11, local_60 != (XSAnnotation *)0x0)) {
        XSAnnotation::setNext(local_60,pXVar11);
        pXVar6 = local_60;
      }
    }
    local_60 = pXVar6;
    iVar7 = (*pDVar9->_vptr_DOMNode[0x2a])(pDVar9,SchemaSymbols::fgATT_XPATH);
    plVar12 = (long *)CONCAT44(extraout_var_00,iVar7);
    if ((plVar12 == (long *)0x0) ||
       (pXVar13 = (XMLCh *)(**(code **)(*plVar12 + 0x150))(plVar12), pXVar13 == (XMLCh *)0x0)) {
LAB_003316b9:
      reportSchemaError(this,(DOMElement *)pDVar9,L"http://apache.org/xml/messages/XMLErrors",0x86);
      goto LAB_003316d0;
    }
    lVar15 = 0;
    do {
      psVar10 = (short *)((long)pXVar13 + lVar15);
      lVar15 = lVar15 + 2;
    } while (*psVar10 != 0);
    if (lVar15 == 2) goto LAB_003316b9;
    pXVar14 = (XercesXPath *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
    XercesXPath::XercesXPath
              (pXVar14,pXVar13,this->fStringPool,
               &this->fSchemaInfo->fNamespaceScope->super_XercesNamespaceResolver,
               this->fEmptyNamespaceURI,true,this->fGrammarPoolMemoryManager);
    this_00 = (IC_Selector *)XMemory::operator_new(0x18,this->fGrammarPoolMemoryManager);
    IC_Selector::IC_Selector(this_00,pXVar14,ic);
    IdentityConstraint::setSelector(ic,this_00);
    pDVar9 = &XUtil::getNextSiblingElement(pDVar9)->super_DOMNode;
    if (pDVar9 == (DOMNode *)0x0) {
      reportSchemaError(this,icElem,L"http://apache.org/xml/messages/XMLErrors",0x83);
      goto LAB_003316d0;
    }
    for (; pDVar9 != (DOMNode *)0x0; pDVar9 = &XUtil::getNextSiblingElement(pDVar9)->super_DOMNode)
    {
      iVar7 = (*pDVar9->_vptr_DOMNode[0x18])(pDVar9);
      psVar10 = (short *)CONCAT44(extraout_var_01,iVar7);
      if (psVar10 == &SchemaSymbols::fgELT_FIELD) {
LAB_0033181f:
        GeneralAttributeCheck::checkAttributes
                  (&this->fAttributeCheck,(DOMElement *)pDVar9,0x14,this,false,this->fNonXSAttList);
        pDVar8 = XUtil::getFirstChildElement(pDVar9);
        pDVar8 = checkContent(this,icElem,pDVar8,true,true);
        if (pDVar8 != (DOMElement *)0x0) {
          reportSchemaError(this,(DOMElement *)pDVar9,L"http://apache.org/xml/messages/XMLErrors",
                            0x4d);
        }
        pXVar11 = this->fAnnotation;
        pXVar6 = local_60;
        if ((pXVar11 == (XSAnnotation *)0x0 & this->fScanner->fGenerateSyntheticAnnotations) == 1) {
          if (this->fNonXSAttList->fCurCount != 0) {
            pXVar11 = generateSyntheticAnnotation(this,(DOMElement *)pDVar9,this->fNonXSAttList);
            this->fAnnotation = pXVar11;
            goto LAB_003318b7;
          }
        }
        else {
LAB_003318b7:
          if ((pXVar11 != (XSAnnotation *)0x0) &&
             (pXVar6 = pXVar11, local_60 != (XSAnnotation *)0x0)) {
            XSAnnotation::setNext(local_60,pXVar11);
            pXVar6 = local_60;
          }
        }
        local_60 = pXVar6;
        iVar7 = (*pDVar9->_vptr_DOMNode[0x2a])(pDVar9,SchemaSymbols::fgATT_XPATH);
        plVar12 = (long *)CONCAT44(extraout_var_02,iVar7);
        if (((plVar12 == (long *)0x0) ||
            (pXVar13 = (XMLCh *)(**(code **)(*plVar12 + 0x150))(plVar12), pXVar13 == (XMLCh *)0x0))
           || (*pXVar13 == L'\0')) {
          reportSchemaError(this,(DOMElement *)pDVar9,L"http://apache.org/xml/messages/XMLErrors",
                            0x86);
          goto LAB_003316d0;
        }
        pXVar14 = (XercesXPath *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
        XercesXPath::XercesXPath
                  (pXVar14,pXVar13,this->fStringPool,
                   &this->fSchemaInfo->fNamespaceScope->super_XercesNamespaceResolver,
                   this->fEmptyNamespaceURI,false,this->fGrammarPoolMemoryManager);
        this_01 = (IC_Field *)XMemory::operator_new(0x18,this->fGrammarPoolMemoryManager);
        IC_Field::IC_Field(this_01,pXVar14,ic);
        this_02 = &ic->fFields->super_BaseRefVectorOf<xercesc_4_0::IC_Field>;
        if (this_02 == (BaseRefVectorOf<xercesc_4_0::IC_Field> *)0x0) {
          this_02 = (BaseRefVectorOf<xercesc_4_0::IC_Field> *)
                    XMemory::operator_new(0x30,ic->fMemoryManager);
          pMVar4 = ic->fMemoryManager;
          ((BaseRefVectorOf<xercesc_4_0::IC_Field> *)&this_02->_vptr_BaseRefVectorOf)->
          _vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_004099b0;
          this_02->fAdoptedElems = true;
          this_02->fCurCount = 0;
          this_02->fMaxCount = 4;
          this_02->fElemList = (IC_Field **)0x0;
          this_02->fMemoryManager = pMVar4;
          iVar7 = (*pMVar4->_vptr_MemoryManager[3])(pMVar4,0x20);
          this_02->fElemList = (IC_Field **)CONCAT44(extraout_var_03,iVar7);
          lVar15 = 0;
          do {
            this_02->fElemList[lVar15] = (IC_Field *)0x0;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
          ((BaseRefVectorOf<xercesc_4_0::IC_Field> *)&this_02->_vptr_BaseRefVectorOf)->
          _vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00409938;
          ic->fFields = (RefVectorOf<xercesc_4_0::IC_Field> *)this_02;
        }
        BaseRefVectorOf<xercesc_4_0::IC_Field>::ensureExtraCapacity(this_02,1);
        XVar5 = this_02->fCurCount;
        this_02->fElemList[XVar5] = this_01;
        this_02->fCurCount = XVar5 + 1;
      }
      else {
        psVar16 = &SchemaSymbols::fgELT_FIELD;
        if (psVar10 == (short *)0x0) {
LAB_003317fd:
          if (*psVar16 == 0) goto LAB_0033181f;
        }
        else {
          psVar16 = &SchemaSymbols::fgELT_FIELD;
          do {
            sVar1 = *psVar10;
            if (sVar1 == 0) goto LAB_003317fd;
            psVar10 = psVar10 + 1;
            sVar2 = *psVar16;
            psVar16 = psVar16 + 1;
          } while (sVar1 == sVar2);
        }
        reportSchemaError(this,(DOMElement *)pDVar9,L"http://apache.org/xml/messages/XMLErrors",0x83
                         );
      }
    }
    if (local_60 != (XSAnnotation *)0x0) {
      SchemaGrammar::putAnnotation(this->fSchemaGrammar,ic,local_60);
    }
    if ((ic->fFields != (RefVectorOf<xercesc_4_0::IC_Field> *)0x0) &&
       (bVar17 = true, (ic->fFields->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fCurCount != 0))
    goto LAB_003316e2;
  }
  bVar17 = false;
LAB_003316e2:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return bVar17;
}

Assistant:

bool TraverseSchema::traverseIdentityConstraint(IdentityConstraint* const ic,
                                                const DOMElement* const icElem) {

    NamespaceScopeManager nsMgr(icElem, fSchemaInfo, this);

    // ------------------------------------------------------------------
    // First, handle any ANNOTATION declaration
    // ------------------------------------------------------------------
    DOMElement* elem = checkContent(icElem, XUtil::getFirstChildElement(icElem), false);
    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(icElem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // ------------------------------------------------------------------
    // Get selector
    // ------------------------------------------------------------------
    if (elem == 0) {

//        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        return false;
    }

    if (!XMLString::equals(elem->getLocalName(), SchemaSymbols::fgELT_SELECTOR)) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        return false;
    }

    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_Selector, this, false, fNonXSAttList
    );
    if (checkContent(icElem, XUtil::getFirstChildElement(elem), true) != 0)
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);
    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    if (fAnnotation)
    {
        if (janAnnot.isDataNull())
            janAnnot.reset(fAnnotation);
        else
            janAnnot.get()->setNext(fAnnotation);
    }

    // ------------------------------------------------------------------
    // Get xpath attribute
    // ------------------------------------------------------------------
    const XMLCh* xpathExpr = getElementAttValue(elem, SchemaSymbols::fgATT_XPATH);
    XMLSize_t    xpathLen = XMLString::stringLen(xpathExpr);

    if (!xpathExpr || !xpathLen) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_XPathExprMissing);
        return false;
    }

    // ------------------------------------------------------------------
    // Parse xpath expression
    // ------------------------------------------------------------------
    try {

        XercesXPath* sXPath = new (fGrammarPoolMemoryManager) XercesXPath(xpathExpr, fStringPool, fSchemaInfo->getNamespaceScope(), fEmptyNamespaceURI, true, fGrammarPoolMemoryManager);
        IC_Selector* icSelector = new (fGrammarPoolMemoryManager) IC_Selector(sXPath, ic);
        ic->setSelector(icSelector);
    }
    catch (const XPathException& e) {

        reportSchemaError(elem, e);
        return false;
    }

    // ------------------------------------------------------------------
    // Get fields
    // ------------------------------------------------------------------
    elem = XUtil::getNextSiblingElement(elem);

    if (elem == 0) {

        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        return false;
    }

    while (elem != 0) {

        if (!XMLString::equals(elem->getLocalName(), SchemaSymbols::fgELT_FIELD)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_BadContent);
        }
        else {
            // General Attribute Checking
            fAttributeCheck.checkAttributes(
                elem, GeneralAttributeCheck::E_Field, this, false, fNonXSAttList
            );
            if (checkContent(icElem, XUtil::getFirstChildElement(elem), true) != 0)
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);
            if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
            {
                fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
            }
            if (fAnnotation)
            {
                if (janAnnot.isDataNull())
                    janAnnot.reset(fAnnotation);
                else
                    janAnnot.get()->setNext(fAnnotation);
            }

            // xpath expression parsing
            xpathExpr = getElementAttValue(elem, SchemaSymbols::fgATT_XPATH);

            if (!xpathExpr || !*xpathExpr) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::IC_XPathExprMissing);
                return false;
            }

            try {

                XercesXPath* fieldXPath = new (fGrammarPoolMemoryManager) XercesXPath
                (
                    xpathExpr
                    , fStringPool
                    , fSchemaInfo->getNamespaceScope()
                    , fEmptyNamespaceURI
                    , false
                    , fGrammarPoolMemoryManager
                );
                IC_Field* icField = new (fGrammarPoolMemoryManager) IC_Field(fieldXPath, ic);
                ic->addField(icField);
            }
            catch (const XPathException& e) {

                reportSchemaError(elem, e);
                return false;
            }
        }

        elem = XUtil::getNextSiblingElement(elem);
    }

    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(ic, janAnnot.release());

    if (ic->getFieldCount() == 0) {
        return false;
    }

    return true;
}